

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoMesh::FindCloseElement
          (TPZGeoMesh *this,TPZVec<double> *x,int64_t *InitialElIndex,int targetDim)

{
  int64_t iVar1;
  int iVar2;
  TPZGeoEl **ppTVar3;
  TPZGeoNode *this_00;
  mapped_type_conflict4 *pmVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  int ic;
  int iVar7;
  TPZGeoEl *this_01;
  TPZGeoEl *pTVar8;
  REAL RVar9;
  double dVar10;
  double local_360;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> distneigh;
  TPZGeoEl *local_318;
  TPZGeoElSide neighbour;
  REAL distcenter;
  TPZGeoElSide gelside;
  TPZGeoElSide centerneigh;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> cornerdist;
  TPZManVector<double,_3> xcorner;
  TPZManVector<double,_3> xcenter;
  TPZManVector<TPZManVector<double,_3>,_8> cornercenter;
  
  TPZManVector<double,_3>::TPZManVector(&xcenter,3);
  TPZManVector<TPZManVector<double,_3>,_8>::TPZManVector(&cornercenter,0);
  if ((this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements <= *InitialElIndex) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgmesh.cpp",
               0x1df);
  }
  ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,*InitialElIndex);
  if (*ppTVar3 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgmesh.cpp",
               0x1e4);
  }
  cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cornerdist._M_t._M_impl.super__Rb_tree_header._M_header;
  cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cornerdist._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar5 = (TPZGeoEl *)0x0;
  this_01 = *ppTVar3;
  cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pTVar5 == this_01) {
LAB_0101391b:
      *InitialElIndex = pTVar5->fIndex;
      local_318 = pTVar5;
      break;
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::clear(&cornerdist._M_t);
    for (iVar7 = 0; iVar2 = (**(code **)(*(long *)this_01 + 0x98))(this_01), iVar7 < iVar2;
        iVar7 = iVar7 + 1) {
      TPZManVector<double,_3>::TPZManVector(&xcorner,3);
      this_00 = TPZGeoEl::NodePtr(this_01,iVar7);
      TPZGeoNode::GetCoordinates(this_00,&xcorner.super_TPZVec<double>);
      distneigh._M_t._M_impl._0_8_ = 0;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar10 = x->fStore[lVar6] - xcorner.super_TPZVec<double>.fStore[lVar6];
        distneigh._M_t._M_impl._0_8_ = (double)distneigh._M_t._M_impl._0_8_ + dVar10 * dVar10;
      }
      if ((double)distneigh._M_t._M_impl._0_8_ < 0.0) {
        distneigh._M_t._M_impl._0_8_ = sqrt((double)distneigh._M_t._M_impl._0_8_);
      }
      else {
        distneigh._M_t._M_impl._0_8_ = SQRT((double)distneigh._M_t._M_impl._0_8_);
      }
      pmVar4 = std::
               map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
               operator[](&cornerdist,(key_type_conflict *)&distneigh);
      *pmVar4 = iVar7;
      TPZManVector<double,_3>::~TPZManVector(&xcorner);
    }
    TPZManVector<double,_3>::TPZManVector(&xcorner,3);
    iVar7 = (**(code **)(*(long *)this_01 + 0xf0))(this_01);
    distneigh._M_t._M_impl._0_8_ = &PTR__TPZGeoElSide_0172da80;
    distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         CONCAT44(distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,iVar7 + -1)
    ;
    distneigh._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_01;
    TPZGeoElSide::CenterX((TPZGeoElSide *)&distneigh,&xcorner.super_TPZVec<double>);
    RVar9 = dist<double>(x,&xcorner.super_TPZVec<double>);
    TPZManVector<double,_3>::~TPZManVector(&xcorner);
    pTVar5 = this_01;
    if ((RVar9 < *(double *)(cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))
       || (*(double *)(cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) < 1e-15)
       ) goto LAB_0101391b;
    gelside.fSide =
         *(int *)&cornerdist._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
    gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    gelside.fGeoEl = this_01;
    TPZGeoElSide::Neighbour(&neighbour,&gelside);
    distneigh._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         distneigh._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &distneigh._M_t._M_impl.super__Rb_tree_header._M_header;
    distneigh._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((neighbour.fGeoEl != gelside.fGeoEl || (neighbour.fSide != gelside.fSide))) {
      iVar7 = (**(code **)(*(long *)neighbour.fGeoEl + 0x210))();
      if (iVar7 == targetDim) {
        TPZManVector<double,_3>::TPZManVector(&xcorner,3);
        pTVar8 = neighbour.fGeoEl;
        iVar7 = (**(code **)(*(long *)neighbour.fGeoEl + 0xf0))(neighbour.fGeoEl);
        centerneigh.fSide = iVar7 + -1;
        centerneigh.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
        centerneigh.fGeoEl = pTVar8;
        TPZGeoElSide::CenterX(&centerneigh,&xcorner.super_TPZVec<double>);
        distcenter = dist<double>(&xcorner.super_TPZVec<double>,x);
        iVar1 = (neighbour.fGeoEl)->fIndex;
        pmVar4 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](&distneigh,&distcenter);
        *pmVar4 = (mapped_type_conflict4)iVar1;
        TPZManVector<double,_3>::~TPZManVector(&xcorner);
      }
      TPZGeoElSide::Neighbour((TPZGeoElSide *)&xcorner,&neighbour);
      neighbour.fGeoEl = (TPZGeoEl *)xcorner.super_TPZVec<double>.fStore;
      neighbour.fSide = (int)xcorner.super_TPZVec<double>.fNElements;
    }
    pTVar8 = this_01;
    local_360 = RVar9;
    if (distneigh._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                           (long)*(int *)&distneigh._M_t._M_impl.super__Rb_tree_header._M_header.
                                          _M_left[1]._M_parent);
      pTVar8 = *ppTVar3;
      local_360 = *(double *)(distneigh._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    }
    if (RVar9 <= local_360) {
      *InitialElIndex = this_01->fIndex;
      local_318 = this_01;
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree(&distneigh._M_t);
    this_01 = pTVar8;
  } while (local_360 < RVar9);
  std::
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  ::~_Rb_tree(&cornerdist._M_t);
  TPZManVector<TPZManVector<double,_3>,_8>::~TPZManVector(&cornercenter);
  TPZManVector<double,_3>::~TPZManVector(&xcenter);
  return local_318;
}

Assistant:

TPZGeoEl * TPZGeoMesh::FindCloseElement(TPZVec<REAL> &x, int64_t & InitialElIndex, int targetDim) const
{
    // this method will not work if targetDim == 0 because it navigates through elements of dimension targetDim
    TPZManVector<REAL,3> xcenter(3);
    TPZManVector<TPZManVector<REAL, 3>, 8> cornercenter;
    // what happens if gelnext == 0 or if InitialIndex is out of scope??
    if (InitialElIndex >= fElementVec.NElements()) {
        DebugStop();
    }
    TPZGeoEl *gelnext = ElementVec()[InitialElIndex];
    
    if (gelnext == 0) {
        DebugStop();
    }
    
    TPZGeoEl *gel = 0;
    REAL geldist;
    std::map<REAL,int> cornerdist;
    while (gel != gelnext) {
        gel = gelnext;
        gelnext = 0;
        cornerdist.clear();
        // compute the corner coordinates
        for (int ic=0; ic<gel->NCornerNodes(); ic++) {
            TPZManVector<REAL,3> xcorner(3);
            gel->NodePtr(ic)->GetCoordinates(xcorner);
            REAL dist = 0.;
            for (int i=0; i<3; i++) {
                dist += (x[i]-xcorner[i])*(x[i]-xcorner[i]);
            }
            dist = sqrt(dist);
            cornerdist[dist]=ic;
        }
        // compute the distance of the center of the element
        {
            geldist = 0.;
            TPZManVector<REAL,3> xcenter(3);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            gelside.CenterX(xcenter);
            geldist = dist(x,xcenter);
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "FindClosestElement Tried element index " << gel->Index() << std::endl;
            sout << "Distance from the center " << geldist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // find the closest corner node
        REAL closestcorner = cornerdist.begin()->first;
        // if the center node is closer than the cornernode, return the element
        if (geldist < closestcorner || closestcorner < 1.e-15) {
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Distance from the closest corner " << closestcorner << "bailing out " << std::endl;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            InitialElIndex = gel->Index();
            return gel;
        }
        // look for all neighbours of the corner side
        TPZGeoElSide gelside(gel,cornerdist.begin()->second);
        TPZGeoElSide neighbour = gelside.Neighbour();
        std::map<REAL,int> distneigh;
        while (neighbour != gelside)
        {
            if (neighbour.Element()->Dimension() == targetDim)
            {
                TPZManVector<REAL,3> center(3);
                TPZGeoElSide centerneigh(neighbour.Element(),neighbour.Element()->NSides()-1);
                centerneigh.CenterX(center);
                REAL distcenter = dist(center,x);
                distneigh[distcenter] = neighbour.Element()->Index();
            }
            neighbour = neighbour.Neighbour();
        }
        // choose the element whose center is closest to the coordinate
        REAL gelnextdist = 0.;
        if (distneigh.size() == 0) {
            gelnext = gel;
            gelnextdist = geldist;
        }
        else {
            gelnext = ElementVec()[distneigh.begin()->second];
            gelnextdist = distneigh.begin()->first;
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Closest element index " << gelnext->Index() << std::endl;
            sout << "Distance from the center " << gelnextdist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // return if its center distance is larger than the distance of the current element
        if (geldist <= gelnextdist) {
            InitialElIndex = gel->Index();
            return gel;
        }
    }
    InitialElIndex = gel->Index();
    return gel;
}